

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_value * jx9_new_scalar(jx9_vm *pVm)

{
  jx9_value *pjVar1;
  
  if (pVm == (jx9_vm *)0x0) {
    return (jx9_value *)0x0;
  }
  if ((pVm->nMagic != 0xdead2bad) &&
     (pjVar1 = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x40), pjVar1 != (jx9_value *)0x0
     )) {
    pjVar1->pVm = (jx9_vm *)0x0;
    (pjVar1->sBlob).pAllocator = (SyMemBackend *)0x0;
    *(undefined8 *)&(pjVar1->sBlob).nFlags = 0;
    *(undefined8 *)&pjVar1->nIdx = 0;
    (pjVar1->x).rVal = 0.0;
    *(undefined8 *)&pjVar1->iFlags = 0;
    (pjVar1->sBlob).pBlob = (void *)0x0;
    (pjVar1->sBlob).nByte = 0;
    (pjVar1->sBlob).mByte = 0;
    pjVar1->pVm = pVm;
    (pjVar1->sBlob).pAllocator = &pVm->sAllocator;
    (pjVar1->sBlob).nFlags = 0;
    pjVar1->iFlags = 0x20;
    return pjVar1;
  }
  return (jx9_value *)0x0;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_new_scalar(jx9_vm *pVm)
{
	jx9_value *pObj;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return 0;
	}
	/* Allocate a new scalar variable */
	pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_value));
	if( pObj == 0 ){
		return 0;
	}
	/* Nullify the new scalar */
	jx9MemObjInit(pVm, pObj);
	return pObj;
}